

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

uint32_t VP8LPredictor13_C(uint32_t *left,uint32_t *top)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = top[-1];
  uVar5 = (*top & *left) + ((*top ^ *left) >> 1 & 0x7f7f7f7f);
  uVar6 = (int)((uVar5 >> 0x18) - (uVar1 >> 0x18)) / 2 + (uVar5 >> 0x18);
  uVar2 = ~uVar6 >> 0x18;
  if (uVar6 < 0x100) {
    uVar2 = uVar6;
  }
  uVar3 = uVar5 >> 0x10 & 0xff;
  uVar3 = (int)(uVar3 - (uVar1 >> 0x10 & 0xff)) / 2 + uVar3;
  uVar6 = ~uVar3 >> 0x18;
  if (uVar3 < 0x100) {
    uVar6 = uVar3;
  }
  uVar4 = uVar5 >> 8 & 0xff;
  uVar4 = (int)(uVar4 - (uVar1 >> 8 & 0xff)) / 2 + uVar4;
  uVar3 = ~uVar4 >> 0x18;
  if (uVar4 < 0x100) {
    uVar3 = uVar4;
  }
  uVar5 = (int)((uVar5 & 0xff) - (uVar1 & 0xff)) / 2 + (uVar5 & 0xff);
  uVar1 = ~uVar5 >> 0x18;
  if (uVar5 < 0x100) {
    uVar1 = uVar5;
  }
  return uVar3 * 0x100 + uVar6 * 0x10000 + uVar2 * 0x1000000 + uVar1;
}

Assistant:

uint32_t VP8LPredictor13_C(const uint32_t* const left,
                           const uint32_t* const top) {
  const uint32_t pred = ClampedAddSubtractHalf(*left, top[0], top[-1]);
  return pred;
}